

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall cmGraphVizWriter::TargetTypeEnabled(cmGraphVizWriter *this,TargetType targetType)

{
  TargetType targetType_local;
  cmGraphVizWriter *this_local;
  
  switch(targetType) {
  case EXECUTABLE:
    this_local._7_1_ = (bool)(this->GenerateForExecutables & 1);
    break;
  case STATIC_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForStaticLibs & 1);
    break;
  case SHARED_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForSharedLibs & 1);
    break;
  case MODULE_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForModuleLibs & 1);
    break;
  case OBJECT_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForObjectLibs & 1);
    break;
  case UTILITY:
    this_local._7_1_ = (bool)(this->GenerateForCustomTargets & 1);
    break;
  case GLOBAL_TARGET:
    this_local._7_1_ = false;
    break;
  case INTERFACE_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForInterfaceLibs & 1);
    break;
  case UNKNOWN_LIBRARY:
    this_local._7_1_ = (bool)(this->GenerateForUnknownLibs & 1);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGraphVizWriter::TargetTypeEnabled(
  cmStateEnums::TargetType targetType) const
{
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmStateEnums::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmStateEnums::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmStateEnums::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    case cmStateEnums::INTERFACE_LIBRARY:
      return this->GenerateForInterfaceLibs;
    case cmStateEnums::OBJECT_LIBRARY:
      return this->GenerateForObjectLibs;
    case cmStateEnums::UNKNOWN_LIBRARY:
      return this->GenerateForUnknownLibs;
    case cmStateEnums::UTILITY:
      return this->GenerateForCustomTargets;
    case cmStateEnums::GLOBAL_TARGET:
      // Built-in targets like edit_cache, etc.
      // We don't need/want those in the dot file.
      return false;
    default:
      break;
  }
  return false;
}